

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

function<bool_(unsigned_int)> *
spvOperandCanBeForwardDeclaredFunction
          (function<bool_(unsigned_int)> *__return_storage_ptr__,Op opcode)

{
  int32_t iVar1;
  code *pcVar2;
  code *pcVar3;
  undefined4 in_register_00000034;
  anon_class_1_0_00000001 *__f;
  uint uVar4;
  ulong uVar5;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  __f = (anon_class_1_0_00000001 *)CONCAT44(in_register_00000034,opcode);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar1 = spvOpcodeGeneratesType(opcode);
  if (iVar1 == 0) {
    if ((int)opcode < 0xf9) {
      if ((int)opcode < 0x47) {
        if ((int)opcode < 0x1c) {
          if (1 < opcode - OpName) {
            uVar4 = opcode - OpEntryPoint;
            goto joined_r0x001c3b0a;
          }
          goto LAB_001c3c2d;
        }
        if (opcode == OpTypeArray) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
        if (opcode == OpTypeForwardPointer) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
        if (opcode == OpFunctionCall) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
      }
      else if ((int)opcode < 0xf5) {
        if (opcode - OpDecorate < 2) {
LAB_001c3c2d:
          pcVar2 = std::
                   _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:570:13)>
                   ::_M_invoke;
          pcVar3 = std::
                   _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:570:13)>
                   ::_M_manager;
          goto LAB_001c3c47;
        }
        if (opcode - OpGroupDecorate < 2) goto LAB_001c3bb2;
      }
      else {
        if (opcode - OpLoopMerge < 2) goto LAB_001c3c2d;
        if (opcode == OpPhi) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
      }
    }
    else if ((int)opcode < 0x14f6) {
      if ((int)opcode < 0x125) {
        if (opcode - OpBranchConditional < 2) {
LAB_001c3bb2:
          pcVar2 = std::
                   _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:576:13)>
                   ::_M_invoke;
          pcVar3 = std::
                   _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:576:13)>
                   ::_M_manager;
          goto LAB_001c3c47;
        }
        if (opcode == OpBranch) goto LAB_001c3c2d;
        if (opcode == OpEnqueueKernel) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
      }
      else {
        uVar5 = (ulong)(opcode - OpGetKernelNDrangeSubGroupCount);
        if (opcode - OpGetKernelNDrangeSubGroupCount < 0x28) {
          if ((3UL >> (uVar5 & 0x3f) & 1) == 0) {
            if ((0xcUL >> (uVar5 & 0x3f) & 1) == 0) {
              if ((0xc000000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_001c3c2d;
              goto LAB_001c3ced;
            }
            pcVar2 = std::
                     _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:602:13)>
                     ::_M_invoke;
            pcVar3 = std::
                     _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:602:13)>
                     ::_M_manager;
          }
          else {
            pcVar2 = std::
                     _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:596:13)>
                     ::_M_invoke;
            pcVar3 = std::
                     _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:596:13)>
                     ::_M_manager;
          }
LAB_001c3c47:
          local_38._M_unused._0_8_ =
               (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor
          ;
          local_38._8_8_ =
               *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8)
          ;
          *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
          goto LAB_001c3c56;
        }
      }
    }
    else if ((int)opcode < 0x1600) {
      if (opcode == OpCooperativeMatrixReduceNV) {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
        return __return_storage_ptr__;
      }
      if (opcode == OpCooperativeMatrixLoadTensorNV) {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
        return __return_storage_ptr__;
      }
      if (opcode == OpCooperativeMatrixPerElementOpNV) {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
        return __return_storage_ptr__;
      }
    }
    else {
      uVar4 = opcode - OpDecorateString;
joined_r0x001c3b0a:
      if (uVar4 < 2) goto LAB_001c3c2d;
    }
LAB_001c3ced:
    std::function<bool(unsigned_int)>::operator=
              ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
  }
  else {
    pcVar2 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:553:11)>
             ::_M_invoke;
    pcVar3 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/operand.cpp:553:11)>
             ::_M_manager;
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
    local_38._8_8_ =
         *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
LAB_001c3c56:
    local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
    (__return_storage_ptr__->super__Function_base)._M_manager = pcVar3;
    local_20 = __return_storage_ptr__->_M_invoker;
    __return_storage_ptr__->_M_invoker = pcVar2;
    if (local_28 != (_Manager_type)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(unsigned)> spvOperandCanBeForwardDeclaredFunction(
    spv::Op opcode) {
  std::function<bool(unsigned index)> out;
  if (spvOpcodeGeneratesType(opcode)) {
    // All types can use forward pointers.
    out = [](unsigned) { return true; };
    return out;
  }
  switch (opcode) {
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
    case spv::Op::OpEntryPoint:
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
    case spv::Op::OpSelectionMerge:
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorateStringGOOGLE:
    case spv::Op::OpBranch:
    case spv::Op::OpLoopMerge:
      out = [](unsigned) { return true; };
      break;
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate:
    case spv::Op::OpBranchConditional:
    case spv::Op::OpSwitch:
      out = [](unsigned index) { return index != 0; };
      break;

    case spv::Op::OpFunctionCall:
      // The Function parameter.
      out = [](unsigned index) { return index == 2; };
      break;

    case spv::Op::OpPhi:
      out = [](unsigned index) { return index > 1; };
      break;

    case spv::Op::OpEnqueueKernel:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 8; };
      break;

    case spv::Op::OpGetKernelNDrangeSubGroupCount:
    case spv::Op::OpGetKernelNDrangeMaxSubGroupSize:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 3; };
      break;

    case spv::Op::OpGetKernelWorkGroupSize:
    case spv::Op::OpGetKernelPreferredWorkGroupSizeMultiple:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 2; };
      break;
    case spv::Op::OpTypeForwardPointer:
      out = [](unsigned index) { return index == 0; };
      break;
    case spv::Op::OpTypeArray:
      out = [](unsigned index) { return index == 1; };
      break;
    case spv::Op::OpCooperativeMatrixPerElementOpNV:
      out = [](unsigned index) { return index == 3; };
      break;
    case spv::Op::OpCooperativeMatrixReduceNV:
      out = [](unsigned index) { return index == 4; };
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
      // approximate, due to variable operands
      out = [](unsigned index) { return index > 6; };
      break;
    default:
      out = [](unsigned) { return false; };
      break;
  }
  return out;
}